

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfStatement.h
# Opt level: O0

void __thiscall IfStatement::execute(IfStatement *this,Environment *env)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_78 [8];
  Environment local;
  shared_ptr<Value> local_30;
  byte local_19;
  Environment *pEStack_18;
  bool conditionTrue;
  Environment *env_local;
  IfStatement *this_local;
  
  pEStack_18 = env;
  env_local = (Environment *)this;
  peVar2 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->condition);
  (**peVar2->_vptr_Expression)
            ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&local_30,
             peVar2,pEStack_18);
  peVar3 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_30);
  iVar1 = (*(peVar3->super_Member)._vptr_Member[5])();
  std::shared_ptr<Value>::~shared_ptr(&local_30);
  local_19 = (byte)iVar1 & 1;
  Environment::Environment((Environment *)local_78,pEStack_18);
  if ((local_19 & 1) == 0) {
    peVar4 = std::__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->falseBlock);
    (**(peVar4->super_Statement)._vptr_Statement)(peVar4,local_78);
  }
  else {
    peVar4 = std::__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->trueBlock);
    (**(peVar4->super_Statement)._vptr_Statement)(peVar4,local_78);
  }
  Environment::~Environment((Environment *)local_78);
  return;
}

Assistant:

void execute(Environment *env) override {
        bool conditionTrue = condition -> evaluate(env) -> asBoolean();
        Environment local = *env;

        if(conditionTrue) {
            trueBlock -> execute(&local);
        } else {
            falseBlock -> execute(&local);
        }
    }